

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void ReportOutput(lemon *lemp)

{
  state *psVar1;
  symbol *psVar2;
  int iVar3;
  size_t sVar4;
  symbol *sp_1;
  int w;
  symbol *sp;
  char local_58 [4];
  int j;
  char buf [20];
  FILE *fp;
  rule *rp;
  action *ap;
  config *cfp;
  state *stp;
  int n;
  int i;
  lemon *lemp_local;
  
  register0x00000000 = (FILE *)file_open(lemp,".out","wb");
  if (register0x00000000 != (FILE *)0x0) {
    for (stp._4_4_ = 0; (int)stp._4_4_ < lemp->nxstate; stp._4_4_ = stp._4_4_ + 1) {
      psVar1 = lemp->sorted[(int)stp._4_4_];
      fprintf(stack0xffffffffffffffc0,"State %d:\n",(ulong)(uint)psVar1->statenum);
      if (lemp->basisflag == 0) {
        ap = (action *)psVar1->cfp;
      }
      else {
        ap = (action *)psVar1->bp;
      }
      while (ap != (action *)0x0) {
        if (ap->type == *(e_action *)&ap->sp->fallback) {
          lemon_sprintf(local_58,"(%d)",(ulong)*(uint *)&ap->sp->field_0x5c);
          fprintf(stack0xffffffffffffffc0,"    %5s ",local_58);
        }
        else {
          fprintf(stack0xffffffffffffffc0,"          ");
        }
        ConfigPrint((FILE *)stack0xffffffffffffffc0,(config *)ap);
        fprintf(stack0xffffffffffffffc0,"\n");
        if (lemp->basisflag == 0) {
          ap = *(action **)&ap[1].type;
        }
        else {
          ap = (action *)ap[1].x.stp;
        }
      }
      fprintf(stack0xffffffffffffffc0,"\n");
      for (rp = (rule *)psVar1->ap; rp != (rule *)0x0; rp = (rule *)rp->rhs) {
        iVar3 = PrintAction((action *)rp,(FILE *)stack0xffffffffffffffc0,0x1e);
        if (iVar3 != 0) {
          fprintf(stack0xffffffffffffffc0,"\n");
        }
      }
      fprintf(stack0xffffffffffffffc0,"\n");
    }
    fprintf(stack0xffffffffffffffc0,"----------------------------------------------------\n");
    fprintf(stack0xffffffffffffffc0,"Symbols:\n");
    fprintf(stack0xffffffffffffffc0,"The first-set of non-terminals is shown after the name.\n\n");
    for (stp._4_4_ = 0; (int)stp._4_4_ < lemp->nsymbol; stp._4_4_ = stp._4_4_ + 1) {
      psVar2 = lemp->symbols[(int)stp._4_4_];
      fprintf(stack0xffffffffffffffc0,"  %3d: %s",(ulong)stp._4_4_,psVar2->name);
      if (psVar2->type == NONTERMINAL) {
        fprintf(stack0xffffffffffffffc0,":");
        if (psVar2->lambda != LEMON_FALSE) {
          fprintf(stack0xffffffffffffffc0," <lambda>");
        }
        for (sp._4_4_ = 0; sp._4_4_ < lemp->nterminal; sp._4_4_ = sp._4_4_ + 1) {
          if ((psVar2->firstset != (char *)0x0) && (psVar2->firstset[sp._4_4_] != '\0')) {
            fprintf(stack0xffffffffffffffc0," %s",lemp->symbols[sp._4_4_]->name);
          }
        }
      }
      if (-1 < psVar2->prec) {
        fprintf(stack0xffffffffffffffc0," (precedence=%d)",(ulong)(uint)psVar2->prec);
      }
      fprintf(stack0xffffffffffffffc0,"\n");
    }
    fprintf(stack0xffffffffffffffc0,"----------------------------------------------------\n");
    fprintf(stack0xffffffffffffffc0,"Syntax-only Symbols:\n");
    fprintf(stack0xffffffffffffffc0,"The following symbols never carry semantic content.\n\n");
    stp._0_4_ = 0;
    for (stp._4_4_ = 0; (int)stp._4_4_ < lemp->nsymbol; stp._4_4_ = stp._4_4_ + 1) {
      psVar2 = lemp->symbols[(int)stp._4_4_];
      if (psVar2->bContent == 0) {
        sVar4 = strlen(psVar2->name);
        if ((0 < (int)stp) && (0x4b < (int)stp + (int)sVar4)) {
          fprintf(stack0xffffffffffffffc0,"\n");
          stp._0_4_ = 0;
        }
        if (0 < (int)stp) {
          fprintf(stack0xffffffffffffffc0," ");
          stp._0_4_ = (int)stp + 1;
        }
        fprintf(stack0xffffffffffffffc0,"%s",psVar2->name);
        stp._0_4_ = (int)sVar4 + (int)stp;
      }
    }
    if (0 < (int)stp) {
      fprintf(stack0xffffffffffffffc0,"\n");
    }
    fprintf(stack0xffffffffffffffc0,"----------------------------------------------------\n");
    fprintf(stack0xffffffffffffffc0,"Rules:\n");
    for (fp = (FILE *)lemp->rule; fp != (FILE *)0x0; fp = *(FILE **)&fp->_cur_column) {
      fprintf(stack0xffffffffffffffc0,"%4d: ",(ulong)*(uint *)((long)&fp->_IO_save_end + 4));
      rule_print((FILE *)stack0xffffffffffffffc0,(rule *)fp);
      fprintf(stack0xffffffffffffffc0,".");
      if (fp->_IO_backup_base != (char *)0x0) {
        fprintf(stack0xffffffffffffffc0," [%s precedence=%d]",*(undefined8 *)fp->_IO_backup_base,
                (ulong)*(uint *)(fp->_IO_backup_base + 0x20));
      }
      fprintf(stack0xffffffffffffffc0,"\n");
    }
    fclose(stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void ReportOutput(struct lemon *lemp)
{
  int i, n;
  struct state *stp;
  struct config *cfp;
  struct action *ap;
  struct rule *rp;
  FILE *fp;

  fp = file_open(lemp,".out","wb");
  if( fp==0 ) return;
  for(i=0; i<lemp->nxstate; i++){
    stp = lemp->sorted[i];
    fprintf(fp,"State %d:\n",stp->statenum);
    if( lemp->basisflag ) cfp=stp->bp;
    else                  cfp=stp->cfp;
    while( cfp ){
      char buf[20];
      if( cfp->dot==cfp->rp->nrhs ){
        lemon_sprintf(buf,"(%d)",cfp->rp->iRule);
        fprintf(fp,"    %5s ",buf);
      }else{
        fprintf(fp,"          ");
      }
      ConfigPrint(fp,cfp);
      fprintf(fp,"\n");
#if 0
      SetPrint(fp,cfp->fws,lemp);
      PlinkPrint(fp,cfp->fplp,"To  ");
      PlinkPrint(fp,cfp->bplp,"From");
#endif
      if( lemp->basisflag ) cfp=cfp->bp;
      else                  cfp=cfp->next;
    }
    fprintf(fp,"\n");
    for(ap=stp->ap; ap; ap=ap->next){
      if( PrintAction(ap,fp,30) ) fprintf(fp,"\n");
    }
    fprintf(fp,"\n");
  }
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Symbols:\n");
  fprintf(fp, "The first-set of non-terminals is shown after the name.\n\n");
  for(i=0; i<lemp->nsymbol; i++){
    int j;
    struct symbol *sp;

    sp = lemp->symbols[i];
    fprintf(fp, "  %3d: %s", i, sp->name);
    if( sp->type==NONTERMINAL ){
      fprintf(fp, ":");
      if( sp->lambda ){
        fprintf(fp, " <lambda>");
      }
      for(j=0; j<lemp->nterminal; j++){
        if( sp->firstset && SetFind(sp->firstset, j) ){
          fprintf(fp, " %s", lemp->symbols[j]->name);
        }
      }
    }
    if( sp->prec>=0 ) fprintf(fp," (precedence=%d)", sp->prec);
    fprintf(fp, "\n");
  }
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Syntax-only Symbols:\n");
  fprintf(fp, "The following symbols never carry semantic content.\n\n");
  for(i=n=0; i<lemp->nsymbol; i++){
    int w;
    struct symbol *sp = lemp->symbols[i];
    if( sp->bContent ) continue;
    w = (int)strlen(sp->name);
    if( n>0 && n+w>75 ){
      fprintf(fp,"\n");
      n = 0;
    }
    if( n>0 ){
      fprintf(fp, " ");
      n++;
    }
    fprintf(fp, "%s", sp->name);
    n += w;
  }
  if( n>0 ) fprintf(fp, "\n");
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Rules:\n");
  for(rp=lemp->rule; rp; rp=rp->next){
    fprintf(fp, "%4d: ", rp->iRule);
    rule_print(fp, rp);
    fprintf(fp,".");
    if( rp->precsym ){
      fprintf(fp," [%s precedence=%d]",
              rp->precsym->name, rp->precsym->prec);
    }
    fprintf(fp,"\n");
  }
  fclose(fp);
  return;
}